

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

ChromeCompositorStateMachine * __thiscall
perfetto::protos::gen::ChromeCompositorStateMachine::operator=
          (ChromeCompositorStateMachine *this,ChromeCompositorStateMachine *param_1)

{
  _Head_base<0UL,_perfetto::protos::gen::ChromeCompositorStateMachine_MajorState_*,_false> _Var1;
  _Head_base<0UL,_perfetto::protos::gen::ChromeCompositorStateMachine_MajorState_*,_false> _Var2;
  _Head_base<0UL,_perfetto::protos::gen::ChromeCompositorStateMachine_MinorState_*,_false> _Var3;
  _Head_base<0UL,_perfetto::protos::gen::ChromeCompositorStateMachine_MinorState_*,_false> _Var4;
  ChromeCompositorStateMachine_MajorState_BeginImplFrameState CVar5;
  ChromeCompositorStateMachine_MajorState_BeginMainFrameState CVar6;
  ChromeCompositorStateMachine_MajorState_LayerTreeFrameSinkState CVar7;
  long lVar8;
  int32_t *piVar9;
  int32_t *piVar10;
  byte bVar11;
  
  bVar11 = 0;
  _Var1._M_head_impl =
       (param_1->major_state_).ptr_._M_t.
       super___uniq_ptr_impl<perfetto::protos::gen::ChromeCompositorStateMachine_MajorState,_std::default_delete<perfetto::protos::gen::ChromeCompositorStateMachine_MajorState>_>
       ._M_t.
       super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeCompositorStateMachine_MajorState_*,_std::default_delete<perfetto::protos::gen::ChromeCompositorStateMachine_MajorState>_>
       .
       super__Head_base<0UL,_perfetto::protos::gen::ChromeCompositorStateMachine_MajorState_*,_false>
       ._M_head_impl;
  _Var2._M_head_impl =
       (this->major_state_).ptr_._M_t.
       super___uniq_ptr_impl<perfetto::protos::gen::ChromeCompositorStateMachine_MajorState,_std::default_delete<perfetto::protos::gen::ChromeCompositorStateMachine_MajorState>_>
       ._M_t.
       super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeCompositorStateMachine_MajorState_*,_std::default_delete<perfetto::protos::gen::ChromeCompositorStateMachine_MajorState>_>
       .
       super__Head_base<0UL,_perfetto::protos::gen::ChromeCompositorStateMachine_MajorState_*,_false>
       ._M_head_impl;
  (_Var2._M_head_impl)->forced_redraw_state_ = (_Var1._M_head_impl)->forced_redraw_state_;
  CVar5 = (_Var1._M_head_impl)->begin_impl_frame_state_;
  CVar6 = (_Var1._M_head_impl)->begin_main_frame_state_;
  CVar7 = (_Var1._M_head_impl)->layer_tree_frame_sink_state_;
  (_Var2._M_head_impl)->next_action_ = (_Var1._M_head_impl)->next_action_;
  (_Var2._M_head_impl)->begin_impl_frame_state_ = CVar5;
  (_Var2._M_head_impl)->begin_main_frame_state_ = CVar6;
  (_Var2._M_head_impl)->layer_tree_frame_sink_state_ = CVar7;
  ::std::__cxx11::string::_M_assign((string *)&(_Var2._M_head_impl)->unknown_fields_);
  ((_Var2._M_head_impl)->_has_field_).super__Base_bitset<1UL> =
       (_Base_bitset<1UL>)((_Var1._M_head_impl)->_has_field_).super__Base_bitset<1UL>._M_w;
  _Var3._M_head_impl =
       (param_1->minor_state_).ptr_._M_t.
       super___uniq_ptr_impl<perfetto::protos::gen::ChromeCompositorStateMachine_MinorState,_std::default_delete<perfetto::protos::gen::ChromeCompositorStateMachine_MinorState>_>
       ._M_t.
       super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeCompositorStateMachine_MinorState_*,_std::default_delete<perfetto::protos::gen::ChromeCompositorStateMachine_MinorState>_>
       .
       super__Head_base<0UL,_perfetto::protos::gen::ChromeCompositorStateMachine_MinorState_*,_false>
       ._M_head_impl;
  _Var4._M_head_impl =
       (this->minor_state_).ptr_._M_t.
       super___uniq_ptr_impl<perfetto::protos::gen::ChromeCompositorStateMachine_MinorState,_std::default_delete<perfetto::protos::gen::ChromeCompositorStateMachine_MinorState>_>
       ._M_t.
       super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeCompositorStateMachine_MinorState_*,_std::default_delete<perfetto::protos::gen::ChromeCompositorStateMachine_MinorState>_>
       .
       super__Head_base<0UL,_perfetto::protos::gen::ChromeCompositorStateMachine_MinorState_*,_false>
       ._M_head_impl;
  piVar9 = &(_Var3._M_head_impl)->commit_count_;
  piVar10 = &(_Var4._M_head_impl)->commit_count_;
  for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
    *(undefined8 *)piVar10 = *(undefined8 *)piVar9;
    piVar9 = piVar9 + ((ulong)bVar11 * -2 + 1) * 2;
    piVar10 = piVar10 + ((ulong)bVar11 * -2 + 1) * 2;
  }
  (_Var4._M_head_impl)->processing_paint_worklets_for_pending_tree_ =
       (_Var3._M_head_impl)->processing_paint_worklets_for_pending_tree_;
  ::std::__cxx11::string::_M_assign((string *)&(_Var4._M_head_impl)->unknown_fields_);
  ((_Var4._M_head_impl)->_has_field_).super__Base_bitset<1UL> =
       (_Base_bitset<1UL>)((_Var3._M_head_impl)->_has_field_).super__Base_bitset<1UL>._M_w;
  ::std::__cxx11::string::_M_assign((string *)&this->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return this;
}

Assistant:

ChromeCompositorStateMachine::ChromeCompositorStateMachine(ChromeCompositorStateMachine&&) noexcept = default;